

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-homedir.c
# Opt level: O3

int run_test_homedir(void)

{
  long lVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  size_t sVar3;
  size_t extraout_RAX;
  uv_loop_t *puVar4;
  uint64_t uVar5;
  uv_loop_t *puVar6;
  char *unaff_RBX;
  uint uVar7;
  uv_timer_t *puVar8;
  long *plVar9;
  int64_t eval_b;
  int64_t eval_a;
  size_t len;
  char homedir [4096];
  long lStack_10b8;
  uv_loop_t *puStack_10b0;
  code *pcStack_10a8;
  code *pcStack_10a0;
  code *pcStack_1098;
  void *pvStack_1090;
  void *pvStack_1088;
  uv_loop_t *puStack_1080;
  uv__queue *puStack_1070;
  uv__queue *puStack_1068;
  undefined1 auStack_1060 [8];
  uv_handle_t *puStack_1058;
  uv_timer_cb p_Stack_1048;
  undefined8 uStack_1040;
  undefined8 uStack_1038;
  undefined8 local_1010;
  char local_1008 [4096];
  
  local_1010 = 0x1000;
  local_1008[0] = '\0';
  sVar3 = strlen(local_1008);
  if (sVar3 == 0) {
    iVar2 = uv_os_homedir(local_1008,&local_1010);
    if (iVar2 != 0) goto LAB_0019bf53;
    unaff_RBX = local_1008;
    sVar3 = strlen(unaff_RBX);
    if (sVar3 != local_1010) goto LAB_0019bf62;
    if ((long)local_1010 < 1) goto LAB_0019bf71;
    if (local_1008[local_1010] != '\0') goto LAB_0019bf80;
    sVar3 = local_1010;
    if (local_1010 == 1) {
      if (local_1008[0] != '/') {
        run_test_homedir_cold_7();
        sVar3 = extraout_RAX;
        goto LAB_0019be2e;
      }
LAB_0019be52:
      local_1010 = 1;
      iVar2 = uv_os_homedir(local_1008,&local_1010);
      if (iVar2 != -0x69) goto LAB_0019bf8f;
      if ((long)local_1010 < 2) goto LAB_0019bf9e;
      iVar2 = uv_os_homedir((char *)0x0,&local_1010);
      if (iVar2 != -0x16) goto LAB_0019bfad;
      iVar2 = uv_os_homedir(local_1008,(size_t *)0x0);
      if (iVar2 != -0x16) goto LAB_0019bfbc;
      local_1010 = 0;
      iVar2 = uv_os_homedir(local_1008,&local_1010);
      if (iVar2 == -0x16) {
        return 0;
      }
      goto LAB_0019bfcb;
    }
LAB_0019be2e:
    if (unaff_RBX[sVar3 - 1] != '/') goto LAB_0019be52;
  }
  else {
    run_test_homedir_cold_1();
LAB_0019bf53:
    run_test_homedir_cold_2();
LAB_0019bf62:
    run_test_homedir_cold_3();
LAB_0019bf71:
    run_test_homedir_cold_4();
LAB_0019bf80:
    run_test_homedir_cold_5();
LAB_0019bf8f:
    run_test_homedir_cold_8();
LAB_0019bf9e:
    run_test_homedir_cold_9();
LAB_0019bfad:
    run_test_homedir_cold_10();
LAB_0019bfbc:
    run_test_homedir_cold_11();
LAB_0019bfcb:
    run_test_homedir_cold_12();
  }
  run_test_homedir_cold_6();
  uVar7 = 0x4c;
  uStack_1038 = unaff_RBX;
  while( true ) {
    puStack_1058 = (uv_handle_t *)0x19bffc;
    puVar4 = (uv_loop_t *)uv_hrtime();
    puStack_1058 = (uv_handle_t *)0x19c009;
    uv_sleep(0x2d);
    puStack_1058 = (uv_handle_t *)0x19c00e;
    uVar5 = uv_hrtime();
    uStack_1040 = uVar5 - (long)puVar4;
    p_Stack_1048 = (uv_timer_cb)0x17d7840;
    if ((ulong)uStack_1040 < (void *)0x17d7841) break;
    uVar7 = uVar7 - 1;
    if (uVar7 < 2) {
      return 0;
    }
  }
  puStack_1058 = (uv_handle_t *)run_test_clock_gettime;
  run_test_hrtime_cold_1();
  puStack_1068 = (uv__queue *)0xffffffffffffffea;
  puStack_1080 = (uv_loop_t *)0x19c066;
  iVar2 = uv_clock_gettime(0x539,(uv_timespec_t *)auStack_1060);
  puStack_1070 = (uv__queue *)(long)iVar2;
  if (puStack_1068 == puStack_1070) {
    puStack_1068 = (uv__queue *)0xfffffffffffffff2;
    puStack_1080 = (uv_loop_t *)0x19c092;
    iVar2 = uv_clock_gettime(0x539,(uv_timespec_t *)0x0);
    puStack_1070 = (uv__queue *)(long)iVar2;
    if (puStack_1068 != puStack_1070) goto LAB_0019c137;
    puStack_1080 = (uv_loop_t *)0x19c0b5;
    iVar2 = uv_clock_gettime(UV_CLOCK_MONOTONIC,(uv_timespec_t *)auStack_1060);
    puStack_1068 = (uv__queue *)(long)iVar2;
    puStack_1070 = (uv__queue *)0x0;
    if (puStack_1068 != (uv__queue *)0x0) goto LAB_0019c146;
    puStack_1080 = (uv_loop_t *)0x19c0e0;
    iVar2 = uv_clock_gettime(UV_CLOCK_REALTIME,(uv_timespec_t *)auStack_1060);
    puStack_1068 = (uv__queue *)(long)iVar2;
    puStack_1070 = (uv__queue *)0x0;
    if (puStack_1068 != (uv__queue *)0x0) goto LAB_0019c155;
    puStack_1068 = (uv__queue *)0x187bcd09900;
    puStack_1070 = (uv__queue *)auStack_1060;
    if ((long)auStack_1060 < 0x187bcd09900) {
      return 0;
    }
  }
  else {
    puStack_1080 = (uv_loop_t *)0x19c137;
    run_test_clock_gettime_cold_1();
LAB_0019c137:
    puStack_1080 = (uv_loop_t *)0x19c146;
    run_test_clock_gettime_cold_2();
LAB_0019c146:
    puStack_1080 = (uv_loop_t *)0x19c155;
    run_test_clock_gettime_cold_3();
LAB_0019c155:
    puStack_1080 = (uv_loop_t *)0x19c164;
    run_test_clock_gettime_cold_4();
  }
  puStack_1080 = (uv_loop_t *)0x19c173;
  run_test_clock_gettime_cold_5();
  pcStack_1098 = (code *)0x19c17e;
  puStack_1080 = puVar4;
  puVar6 = uv_default_loop();
  pcStack_1098 = (code *)0x19c18d;
  iVar2 = uv_idle_init(puVar6,&idle_handle);
  pvStack_1088 = (void *)(long)iVar2;
  pvStack_1090 = (void *)0x0;
  if (pvStack_1088 == (void *)0x0) {
    pcStack_1098 = (code *)0x19c1be;
    iVar2 = uv_idle_start(&idle_handle,idle_cb);
    pvStack_1088 = (void *)(long)iVar2;
    pvStack_1090 = (void *)0x0;
    if (pvStack_1088 != (void *)0x0) goto LAB_0019c3a7;
    pcStack_1098 = (code *)0x19c1e1;
    puVar6 = uv_default_loop();
    pcStack_1098 = (code *)0x19c1f0;
    iVar2 = uv_check_init(puVar6,&check_handle);
    pvStack_1088 = (void *)(long)iVar2;
    pvStack_1090 = (void *)0x0;
    if (pvStack_1088 != (void *)0x0) goto LAB_0019c3b4;
    pcStack_1098 = (code *)0x19c221;
    iVar2 = uv_check_start(&check_handle,check_cb);
    pvStack_1088 = (void *)(long)iVar2;
    pvStack_1090 = (void *)0x0;
    if (pvStack_1088 != (void *)0x0) goto LAB_0019c3c1;
    pcStack_1098 = (code *)0x19c244;
    puVar6 = uv_default_loop();
    pcStack_1098 = (code *)0x19c253;
    iVar2 = uv_timer_init(puVar6,&timer_handle);
    pvStack_1088 = (void *)(long)iVar2;
    pvStack_1090 = (void *)0x0;
    if (pvStack_1088 != (void *)0x0) goto LAB_0019c3ce;
    pcStack_1098 = (code *)0x19c28b;
    iVar2 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    pvStack_1088 = (void *)(long)iVar2;
    pvStack_1090 = (void *)0x0;
    if (pvStack_1088 != (void *)0x0) goto LAB_0019c3db;
    pcStack_1098 = (code *)0x19c2ae;
    puVar6 = uv_default_loop();
    pcStack_1098 = (code *)0x19c2b8;
    iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
    pvStack_1088 = (void *)(long)iVar2;
    pvStack_1090 = (void *)0x0;
    if (pvStack_1088 != (void *)0x0) goto LAB_0019c3e8;
    pvStack_1088 = (void *)(long)idle_cb_called;
    pvStack_1090 = (void *)0x0;
    if ((long)pvStack_1088 < 1) goto LAB_0019c3f5;
    pvStack_1088 = (void *)0x1;
    pvStack_1090 = (void *)(long)timer_cb_called;
    if (pvStack_1090 != (void *)0x1) goto LAB_0019c402;
    pvStack_1088 = (void *)0x3;
    pvStack_1090 = (void *)(long)close_cb_called;
    if (pvStack_1090 != (void *)0x3) goto LAB_0019c40f;
    pcStack_1098 = (code *)0x19c344;
    puVar4 = uv_default_loop();
    pcStack_1098 = (code *)0x19c358;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    pcStack_1098 = (code *)0x19c362;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pvStack_1088 = (void *)0x0;
    pcStack_1098 = (code *)0x19c370;
    puVar6 = uv_default_loop();
    pcStack_1098 = (code *)0x19c378;
    iVar2 = uv_loop_close(puVar6);
    pvStack_1090 = (void *)(long)iVar2;
    if (pvStack_1088 == pvStack_1090) {
      pcStack_1098 = (code *)0x19c392;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1098 = (code *)0x19c3a7;
    run_test_idle_starvation_cold_1();
LAB_0019c3a7:
    pcStack_1098 = (code *)0x19c3b4;
    run_test_idle_starvation_cold_2();
LAB_0019c3b4:
    pcStack_1098 = (code *)0x19c3c1;
    run_test_idle_starvation_cold_3();
LAB_0019c3c1:
    pcStack_1098 = (code *)0x19c3ce;
    run_test_idle_starvation_cold_4();
LAB_0019c3ce:
    pcStack_1098 = (code *)0x19c3db;
    run_test_idle_starvation_cold_5();
LAB_0019c3db:
    pcStack_1098 = (code *)0x19c3e8;
    run_test_idle_starvation_cold_6();
LAB_0019c3e8:
    pcStack_1098 = (code *)0x19c3f5;
    run_test_idle_starvation_cold_7();
LAB_0019c3f5:
    pcStack_1098 = (code *)0x19c402;
    run_test_idle_starvation_cold_8();
LAB_0019c402:
    pcStack_1098 = (code *)0x19c40f;
    run_test_idle_starvation_cold_9();
LAB_0019c40f:
    pcStack_1098 = (code *)0x19c41c;
    run_test_idle_starvation_cold_10();
  }
  puVar8 = (uv_timer_t *)&pvStack_1088;
  pcStack_1098 = idle_cb;
  run_test_idle_starvation_cold_11();
  if (puVar8 == (uv_timer_t *)&idle_handle) {
    pcStack_10a0 = (code *)0x19c43b;
    pcStack_1098._0_4_ = extraout_EAX;
    idle_cb_cold_2();
    return (int)pcStack_1098;
  }
  pcStack_10a0 = check_cb;
  idle_cb_cold_1();
  if (puVar8 == (uv_timer_t *)&check_handle) {
    pcStack_10a8 = (code *)0x19c454;
    pcStack_10a0._0_4_ = extraout_EAX_00;
    check_cb_cold_2();
    return (int)pcStack_10a0;
  }
  pcStack_10a8 = timer_cb;
  check_cb_cold_1();
  if (puVar8 == &timer_handle) {
    puStack_10b0 = (uv_loop_t *)0x19c46d;
    pcStack_10a8._0_4_ = extraout_EAX_01;
    timer_cb_cold_2();
    return (int)pcStack_10a8;
  }
  puStack_10b0 = (uv_loop_t *)run_test_idle_check;
  timer_cb_cold_1();
  puStack_10b0 = puVar4;
  puVar4 = uv_default_loop();
  iVar2 = uv_idle_init(puVar4,&idle_handle);
  lStack_10b8 = (long)iVar2;
  if (lStack_10b8 == 0) {
    iVar2 = uv_idle_start(&idle_handle,idle_stop);
    lStack_10b8 = (long)iVar2;
    if (lStack_10b8 != 0) goto LAB_0019c695;
    puVar4 = uv_default_loop();
    iVar2 = uv_check_init(puVar4,&check_handle);
    lStack_10b8 = (long)iVar2;
    if (lStack_10b8 != 0) goto LAB_0019c6a2;
    iVar2 = uv_check_start(&check_handle,check_cb);
    lStack_10b8 = (long)iVar2;
    if (lStack_10b8 != 0) goto LAB_0019c6af;
    lStack_10b8 = 1;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_ONCE);
    if (lStack_10b8 != iVar2) goto LAB_0019c6bc;
    lStack_10b8 = 1;
    if (check_cb_called != 1) goto LAB_0019c6c9;
    lStack_10b8 = (long)close_cb_called;
    if (lStack_10b8 != 0) goto LAB_0019c6d6;
    uv_close((uv_handle_t *)&idle_handle,close_cb);
    uv_close((uv_handle_t *)&check_handle,close_cb);
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_ONCE);
    lStack_10b8 = (long)iVar2;
    if (lStack_10b8 != 0) goto LAB_0019c6e3;
    lStack_10b8 = 2;
    if (close_cb_called == 2) {
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      lStack_10b8 = 0;
      puVar4 = uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (lStack_10b8 == iVar2) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0019c6fd;
    }
  }
  else {
    run_test_idle_check_cold_1();
LAB_0019c695:
    run_test_idle_check_cold_2();
LAB_0019c6a2:
    run_test_idle_check_cold_3();
LAB_0019c6af:
    run_test_idle_check_cold_4();
LAB_0019c6bc:
    run_test_idle_check_cold_5();
LAB_0019c6c9:
    run_test_idle_check_cold_6();
LAB_0019c6d6:
    run_test_idle_check_cold_7();
LAB_0019c6e3:
    run_test_idle_check_cold_8();
  }
  run_test_idle_check_cold_9();
LAB_0019c6fd:
  plVar9 = &lStack_10b8;
  run_test_idle_check_cold_10();
  if ((*(byte *)(plVar9 + 7) & 4) != 0) {
    lVar1 = plVar9[9];
    *(long *)plVar9[10] = lVar1;
    *(long *)(lVar1 + 8) = plVar9[10];
    uVar7 = *(uint *)(plVar9 + 7);
    if (((uVar7 & 4) != 0) && (*(uint *)(plVar9 + 7) = uVar7 & 0xfffffffb, (uVar7 & 8) != 0)) {
      *(int *)(plVar9[1] + 8) = *(int *)(plVar9[1] + 8) + -1;
    }
  }
  return 0;
}

Assistant:

TEST_IMPL(homedir) {
  char homedir[PATHMAX];
  size_t len;
  int r;

  /* Test the normal case */
  len = sizeof homedir;
  homedir[0] = '\0';
  ASSERT_OK(strlen(homedir));
  r = uv_os_homedir(homedir, &len);
  ASSERT_OK(r);
  ASSERT_EQ(strlen(homedir), len);
  ASSERT_GT(len, 0);
  ASSERT_EQ(homedir[len], '\0');

#ifdef _WIN32
  if (len == 3 && homedir[1] == ':')
    ASSERT_EQ(homedir[2], '\\');
  else
    ASSERT_NE(homedir[len - 1], '\\');
#else
  if (len == 1)
    ASSERT_EQ(homedir[0], '/');
  else
    ASSERT_NE(homedir[len - 1], '/');
#endif

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_homedir(homedir, &len);
  ASSERT_EQ(r, UV_ENOBUFS);
  ASSERT_GT(len, SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_homedir(NULL, &len);
  ASSERT_EQ(r, UV_EINVAL);
  r = uv_os_homedir(homedir, NULL);
  ASSERT_EQ(r, UV_EINVAL);
  len = 0;
  r = uv_os_homedir(homedir, &len);
  ASSERT_EQ(r, UV_EINVAL);

  return 0;
}